

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_init_write_internal(qpdf_data qpdf)

{
  __shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>,
               &local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
    if ((qpdf->output_buffer).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      local_18._M_ptr = (element_type *)0x0;
      local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(qpdf->output_buffer).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_18);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
      qpdf->write_memory = false;
      qpdf->filename = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void
qpdf_init_write_internal(qpdf_data qpdf)
{
    if (qpdf->qpdf_writer.get()) {
        QTC::TC("qpdf", "qpdf-c called qpdf_init_write multiple times");
        qpdf->qpdf_writer = nullptr;
        if (qpdf->output_buffer.get()) {
            qpdf->output_buffer = nullptr;
            qpdf->write_memory = false;
            qpdf->filename = nullptr;
        }
    }
}